

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::TimestampType::write(TimestampType *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ssize_t sVar9;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"TimestampType");
  iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"isAdjustedToUTC",2,1);
  iVar3 = (*this_00->_vptr_TProtocol[0xf])(this_00,(ulong)this->isAdjustedToUTC);
  iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
  __n_00 = 2;
  iVar5 = (*this_00->_vptr_TProtocol[6])(this_00,"unit",0xc);
  sVar9 = TimeUnit::write(&this->unit,__fd,__buf_00,__n_00);
  iVar6 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar7 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar8 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar7 + iVar8 + iVar5 + (int)sVar9 + iVar6 + iVar3 + iVar4 + iVar2 + iVar1);
}

Assistant:

uint32_t TimestampType::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("TimestampType");

  xfer += oprot->writeFieldBegin("isAdjustedToUTC", ::apache::thrift::protocol::T_BOOL, 1);
  xfer += oprot->writeBool(this->isAdjustedToUTC);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("unit", ::apache::thrift::protocol::T_STRUCT, 2);
  xfer += this->unit.write(oprot);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}